

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_win_unpart(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int64_t i00;
  long lVar13;
  long lVar14;
  ggml_tensor *src0;
  long local_58;
  int local_38;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type == GGML_TYPE_F32) {
    lVar2 = dst->ne[1];
    lVar14 = (long)dst->op_params[0];
    lVar3 = dst->ne[2];
    if (0 < lVar3) {
      lVar4 = dst->ne[0];
      local_58 = 0;
      lVar11 = 0;
      lVar5 = pgVar1->ne[0];
      lVar6 = pgVar1->ne[1];
      lVar7 = pgVar1->ne[2];
      do {
        if (0 < lVar2) {
          lVar12 = 0;
          lVar10 = local_58;
          do {
            if (0 < lVar4) {
              local_38 = (int)(((lVar14 - lVar2 % lVar14) % lVar14 + lVar2) / lVar14);
              lVar13 = 0;
              pvVar8 = pgVar1->data;
              pvVar9 = dst->data;
              do {
                *(undefined4 *)((long)pvVar9 + lVar13 * 4 + lVar10) =
                     *(undefined4 *)
                      ((long)pvVar8 +
                      lVar13 * 4 +
                      ((((int)(lVar12 / lVar14) + (int)(lVar11 / lVar14) * local_38) * lVar7 +
                       lVar11 % lVar14) * lVar6 + lVar12 % lVar14) * lVar5 * 4);
                lVar13 = lVar13 + 1;
              } while (lVar4 != lVar13);
            }
            lVar12 = lVar12 + 1;
            lVar10 = lVar10 + lVar4 * 4;
          } while (lVar12 != lVar2);
        }
        lVar11 = lVar11 + 1;
        local_58 = local_58 + lVar2 * lVar4 * 4;
      } while (lVar11 != lVar3);
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
             ,0x1e23,"fatal error");
}

Assistant:

void ggml_compute_forward_win_unpart(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_win_unpart_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}